

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::ConsoleReporter::printClosedHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  undefined8 in_RAX;
  size_t sVar2;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  printOpenHeader(this,_name);
  poVar1 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam0000000000194070 = 0x2e2e2e2e2e2e2e;
    uRam0000000000194077._0_1_ = '.';
    uRam0000000000194077._1_1_ = '.';
    uRam0000000000194077._2_1_ = '.';
    uRam0000000000194077._3_1_ = '.';
    uRam0000000000194077._4_1_ = '.';
    uRam0000000000194077._5_1_ = '.';
    uRam0000000000194077._6_1_ = '.';
    uRam0000000000194077._7_1_ = '.';
    DAT_00194060 = '.';
    DAT_00194060_1._0_1_ = '.';
    DAT_00194060_1._1_1_ = '.';
    DAT_00194060_1._2_1_ = '.';
    DAT_00194060_1._3_1_ = '.';
    DAT_00194060_1._4_1_ = '.';
    DAT_00194060_1._5_1_ = '.';
    DAT_00194060_1._6_1_ = '.';
    uRam0000000000194068 = 0x2e2e2e2e2e2e2e;
    DAT_0019406f = 0x2e;
    DAT_00194050 = '.';
    DAT_00194050_1._0_1_ = '.';
    DAT_00194050_1._1_1_ = '.';
    DAT_00194050_1._2_1_ = '.';
    DAT_00194050_1._3_1_ = '.';
    DAT_00194050_1._4_1_ = '.';
    DAT_00194050_1._5_1_ = '.';
    DAT_00194050_1._6_1_ = '.';
    uRam0000000000194058._0_1_ = '.';
    uRam0000000000194058._1_1_ = '.';
    uRam0000000000194058._2_1_ = '.';
    uRam0000000000194058._3_1_ = '.';
    uRam0000000000194058._4_1_ = '.';
    uRam0000000000194058._5_1_ = '.';
    uRam0000000000194058._6_1_ = '.';
    uRam0000000000194058._7_1_ = '.';
    DAT_00194040 = '.';
    DAT_00194040_1._0_1_ = '.';
    DAT_00194040_1._1_1_ = '.';
    DAT_00194040_1._2_1_ = '.';
    DAT_00194040_1._3_1_ = '.';
    DAT_00194040_1._4_1_ = '.';
    DAT_00194040_1._5_1_ = '.';
    DAT_00194040_1._6_1_ = '.';
    uRam0000000000194048._0_1_ = '.';
    uRam0000000000194048._1_1_ = '.';
    uRam0000000000194048._2_1_ = '.';
    uRam0000000000194048._3_1_ = '.';
    uRam0000000000194048._4_1_ = '.';
    uRam0000000000194048._5_1_ = '.';
    uRam0000000000194048._6_1_ = '.';
    uRam0000000000194048._7_1_ = '.';
    getLineOfChars<(char)46>()::line = '.';
    getLineOfChars<(char)46>()::line_1._0_1_ = '.';
    getLineOfChars<(char)46>()::line_1._1_1_ = '.';
    getLineOfChars<(char)46>()::line_1._2_1_ = '.';
    getLineOfChars<(char)46>()::line_1._3_1_ = '.';
    getLineOfChars<(char)46>()::line_1._4_1_ = '.';
    getLineOfChars<(char)46>()::line_1._5_1_ = '.';
    getLineOfChars<(char)46>()::line_1._6_1_ = '.';
    uRam0000000000194038._0_1_ = '.';
    uRam0000000000194038._1_1_ = '.';
    uRam0000000000194038._2_1_ = '.';
    uRam0000000000194038._3_1_ = '.';
    uRam0000000000194038._4_1_ = '.';
    uRam0000000000194038._5_1_ = '.';
    uRam0000000000194038._6_1_ = '.';
    uRam0000000000194038._7_1_ = '.';
    DAT_0019407f = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)46>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)46>()::line,sVar2)
  ;
  uStack_18 = CONCAT17(10,(undefined7)uStack_18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_18 + 7),1);
  return;
}

Assistant:

void ConsoleReporter::printClosedHeader(std::string const& _name) {
    printOpenHeader(_name);
    stream << getLineOfChars<'.'>() << '\n';
}